

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawstr.c
# Opt level: O0

char Curl_raw_toupper(char in)

{
  char local_9;
  char in_local;
  
  local_9 = in;
  switch(in) {
  case 'a':
    local_9 = 'A';
    break;
  case 'b':
    local_9 = 'B';
    break;
  case 'c':
    local_9 = 'C';
    break;
  case 'd':
    local_9 = 'D';
    break;
  case 'e':
    local_9 = 'E';
    break;
  case 'f':
    local_9 = 'F';
    break;
  case 'g':
    local_9 = 'G';
    break;
  case 'h':
    local_9 = 'H';
    break;
  case 'i':
    local_9 = 'I';
    break;
  case 'j':
    local_9 = 'J';
    break;
  case 'k':
    local_9 = 'K';
    break;
  case 'l':
    local_9 = 'L';
    break;
  case 'm':
    local_9 = 'M';
    break;
  case 'n':
    local_9 = 'N';
    break;
  case 'o':
    local_9 = 'O';
    break;
  case 'p':
    local_9 = 'P';
    break;
  case 'q':
    local_9 = 'Q';
    break;
  case 'r':
    local_9 = 'R';
    break;
  case 's':
    local_9 = 'S';
    break;
  case 't':
    local_9 = 'T';
    break;
  case 'u':
    local_9 = 'U';
    break;
  case 'v':
    local_9 = 'V';
    break;
  case 'w':
    local_9 = 'W';
    break;
  case 'x':
    local_9 = 'X';
    break;
  case 'y':
    local_9 = 'Y';
    break;
  case 'z':
    local_9 = 'Z';
  }
  return local_9;
}

Assistant:

char Curl_raw_toupper(char in)
{
  switch (in) {
  case 'a':
    return 'A';
  case 'b':
    return 'B';
  case 'c':
    return 'C';
  case 'd':
    return 'D';
  case 'e':
    return 'E';
  case 'f':
    return 'F';
  case 'g':
    return 'G';
  case 'h':
    return 'H';
  case 'i':
    return 'I';
  case 'j':
    return 'J';
  case 'k':
    return 'K';
  case 'l':
    return 'L';
  case 'm':
    return 'M';
  case 'n':
    return 'N';
  case 'o':
    return 'O';
  case 'p':
    return 'P';
  case 'q':
    return 'Q';
  case 'r':
    return 'R';
  case 's':
    return 'S';
  case 't':
    return 'T';
  case 'u':
    return 'U';
  case 'v':
    return 'V';
  case 'w':
    return 'W';
  case 'x':
    return 'X';
  case 'y':
    return 'Y';
  case 'z':
    return 'Z';
  }
  return in;
}